

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  _Elt_pointer psVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  __l;
  allocator_type local_36a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_> timers
  ;
  _Any_data local_258;
  code *local_248;
  _Elt_pointer psStack_240;
  t_loop *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  char *local_218;
  size_type local_210;
  char local_208 [8];
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  code *local_1e8;
  code *local_1e0;
  char *local_1d8;
  size_type local_1d0;
  char local_1c8 [8];
  undefined8 uStack_1c0;
  t_loop *local_1b8;
  undefined8 local_1b0;
  code *local_1a8;
  code *local_1a0;
  char *local_198;
  size_type local_190;
  char local_188 [8];
  undefined8 uStack_180;
  t_loop *local_178;
  undefined8 local_170;
  code *local_168;
  code *local_160;
  char *local_158;
  size_type local_150;
  char local_148 [8];
  undefined8 uStack_140;
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  *local_138;
  t_loop *local_130;
  code *local_128;
  code *local_120;
  char *local_118;
  size_type local_110;
  char local_108 [8];
  undefined8 uStack_100;
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  *local_f8;
  undefined8 local_f0;
  code *local_e8;
  code *local_e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  commands;
  t_loop loop;
  _Map_pointer local_48;
  size_t sStack_40;
  _Elt_pointer local_38;
  _Elt_pointer psStack_30;
  
  suisha::t_loop::t_loop(&loop);
  timers.
  super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  timers.
  super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  timers.
  super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  timers.
  super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = psStack_30;
  psVar2 = psStack_30;
  if (local_38 != (_Elt_pointer)0x0) {
    timers.
    super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
    ._M_impl.super__Deque_impl_data._M_map = local_48;
    timers.
    super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = sStack_40;
    timers.
    super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = local_38;
    psVar2 = (_Elt_pointer)0x0;
  }
  local_248 = (code *)0x0;
  psStack_240 = (_Elt_pointer)0x0;
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  commands._M_t._M_impl._0_8_ = operator_new(0x20);
  *(undefined8 *)(commands._M_t._M_impl._0_8_ + 0x10) = 0;
  *(undefined8 *)commands._M_t._M_impl._0_8_ = 0;
  *(undefined8 *)(commands._M_t._M_impl._0_8_ + 8) = 0;
  *(_Elt_pointer *)(commands._M_t._M_impl._0_8_ + 0x18) = psStack_30;
  if (local_38 != (_Elt_pointer)0x0) {
    *(_Map_pointer *)commands._M_t._M_impl._0_8_ =
         timers.
         super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
         ._M_impl.super__Deque_impl_data._M_map;
    *(size_t *)(commands._M_t._M_impl._0_8_ + 8) =
         timers.
         super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    *(_Elt_pointer *)(commands._M_t._M_impl._0_8_ + 0x10) = local_38;
    timers.
    super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    timers.
    super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  }
  commands._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_258._8_8_;
  local_248 = (code *)0x0;
  psStack_240 = psVar2;
  std::_Function_base::~_Function_base((_Function_base *)&local_258);
  std::_Function_base::~_Function_base((_Function_base *)&timers);
  std::
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ::_Deque_base(&timers.
                 super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
               );
  s_abi_cxx11_(&local_2c8,"quit",4);
  local_258._M_unused._M_object = &local_248;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p == &local_2c8.field_2) {
    psStack_240 = (_Elt_pointer)local_2c8.field_2._8_8_;
  }
  else {
    local_258._M_unused._M_object = local_2c8._M_dataplus._M_p;
  }
  local_258._8_8_ = local_2c8._M_string_length;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  local_230 = 0;
  local_220 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:20:13)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:20:13)>
              ::_M_manager;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_238 = &loop;
  s_abi_cxx11_(&local_2e8,"echo",4);
  local_210 = local_2e8._M_string_length;
  local_218 = local_208;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p == &local_2e8.field_2) {
    uStack_200 = local_2e8.field_2._8_8_;
  }
  else {
    local_218 = local_2e8._M_dataplus._M_p;
  }
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:24:13)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:24:13)>
              ::_M_manager;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  s_abi_cxx11_(&local_308,"post",4);
  local_1d8 = local_1c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p == &local_308.field_2) {
    uStack_1c0 = local_308.field_2._8_8_;
  }
  else {
    local_1d8 = local_308._M_dataplus._M_p;
  }
  local_1d0 = local_308._M_string_length;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  local_1b0 = 0;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:30:13)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:30:13)>
              ::_M_manager;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_1b8 = &loop;
  s_abi_cxx11_(&local_328,"in",2);
  local_198 = local_188;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p == &local_328.field_2) {
    uStack_180 = local_328.field_2._8_8_;
  }
  else {
    local_198 = local_328._M_dataplus._M_p;
  }
  local_190 = local_328._M_string_length;
  local_328._M_string_length = 0;
  local_328.field_2._M_local_buf[0] = '\0';
  local_170 = 0;
  local_160 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:39:11)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:39:11)>
              ::_M_manager;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_178 = &loop;
  s_abi_cxx11_(&local_348,"every",5);
  local_150 = local_348._M_string_length;
  local_158 = local_148;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p == &local_348.field_2) {
    uStack_140 = local_348.field_2._8_8_;
  }
  else {
    local_158 = local_348._M_dataplus._M_p;
  }
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  local_120 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:49:14)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:49:14)>
              ::_M_manager;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_138 = &timers.
               super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ;
  local_130 = &loop;
  s_abi_cxx11_(&local_368,"stop",4);
  local_118 = local_108;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p == &local_368.field_2) {
    uStack_100 = local_368.field_2._8_8_;
  }
  else {
    local_118 = local_368._M_dataplus._M_p;
  }
  local_110 = local_368._M_string_length;
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  local_f0 = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:59:13)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:59:13)>
             ::_M_manager;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_258;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_f8 = &timers.
              super__Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::map(&commands,__l,&local_369,&local_36a);
  lVar1 = 0x140;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
             *)((long)&local_258 + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  local_258._8_8_ = 0;
  psStack_240 = (_Elt_pointer)
                std::
                _Function_handler<void_(bool,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:66:31)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(bool,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:66:31)>
              ::_M_manager;
  local_258._M_unused._M_object = &commands;
  suisha::t_loop::f_poll((int)&loop,false,true,(function *)0x0);
  std::_Function_base::~_Function_base((_Function_base *)&local_258);
  suisha::t_loop::f_run();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::~_Rb_tree(&commands._M_t);
  std::deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>::
  ~deque(&timers);
  suisha::t_loop::~t_loop(&loop);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	t_loop loop;
	loop.v_wait = [wait = std::move(loop.v_wait)]
	{
		std::cout << "before wait"sv << std::endl;
		wait();
		std::cout << "after wait"sv << std::endl;
	};
	std::deque<std::shared_ptr<t_timer>> timers;
	std::map<std::string, std::function<void()>> commands = {
		{"quit"s, [&]
		{
			loop.f_exit();
		}},
		{"echo"s, []
		{
			std::string value;
			std::cin >> value;
			std::cout << value << std::endl;
		}},
		{"post"s, [&]
		{
			std::string value;
			std::cin >> value;
			loop.f_post([value]
			{
				std::cout << "posted: "sv << value << std::endl;
			});
		}},
		{"in"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			loop.f_timer([value]
			{
				std::cout << "single: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval), true);
		}},
		{"every"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			timers.push_back(loop.f_timer([value]
			{
				std::cout << "repeat: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval)));
		}},
		{"stop"s, [&]
		{
			timers.front()->f_stop();
			timers.pop_front();
		}}
	};
	try {
		loop.f_poll(0, true, false, [&](bool a_readable, bool a_writable)
		{
			if (!a_readable) return;
			std::string command;
			std::cin >> command;
			auto i = commands.find(command);
			if (i == commands.end())
				std::cerr << "unknown command: "sv << command << std::endl;
			else
				i->second();
		});
		loop.f_run();
		return EXIT_SUCCESS;
	} catch (std::exception& e) {
		std::cerr << "Error: "sv << e.what() << std::endl;
		return EXIT_FAILURE;
	}
}